

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,12ul,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_12UL> *fmt,character_t<char> *others,
               unsigned_integer_t<unsigned_short,_2U,_4U> *others_1,character_t<char> *others_2,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_3,character_t<char> *others_4,
               unsigned_integer_t<unsigned_char,_2U,_2U> *others_5,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *others_6,character_t<char> *others_7,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_8)

{
  bool bVar1;
  value_type vVar2;
  const_reference pvVar3;
  value_type *pvVar4;
  reference ppcVar5;
  reference pvVar6;
  char *pcVar7;
  char *str_1;
  size_t k_1;
  ulong uStack_d8;
  char_type ch;
  size_t i;
  static_string<char,_4UL> *str;
  size_t k;
  array<bool,_12UL> is_match;
  array<const_char_*,_12UL> str_list;
  character_t<char> *others_local_2;
  unsigned_integer_t<unsigned_short,_2U,_4U> *others_local_1;
  character_t<char> *others_local;
  aliases_t<char,_4UL,_unsigned_char,_12UL> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  for (str = (static_string<char,_4UL> *)0x0; str < (static_string<char,_4UL> *)0xc;
      str = (static_string<char,_4UL> *)((str->m_data)._M_elems + 1)) {
    pvVar3 = std::array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL>::operator[]
                       (fmt->aliases,(size_type)str);
    pvVar4 = static_string<char,_4UL>::c_str(&pvVar3->first);
    ppcVar5 = std::array<const_char_*,_12UL>::operator[]
                        ((array<const_char_*,_12UL> *)(is_match._M_elems + 4),(size_type)str);
    *ppcVar5 = pvVar4;
    bVar1 = static_string<char,_4UL>::empty(&pvVar3->first);
    pvVar6 = std::array<bool,_12UL>::operator[]((array<bool,_12UL> *)((long)&k + 4),(size_type)str);
    *pvVar6 = (value_type_conflict4)((bVar1 ^ 0xffU) & 1);
  }
  uStack_d8 = 0;
  while( true ) {
    if (3 < uStack_d8) {
      return false;
    }
    bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator==
                      (pos,end);
    if (bVar1) break;
    vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator*(pos)
    ;
    for (str_1 = (char *)0x0; str_1 < (char *)0xc; str_1 = str_1 + 1) {
      pvVar6 = std::array<bool,_12UL>::operator[]
                         ((array<bool,_12UL> *)((long)&k + 4),(size_type)str_1);
      if ((*pvVar6 & 1U) != 0) {
        ppcVar5 = std::array<const_char_*,_12UL>::operator[]
                            ((array<const_char_*,_12UL> *)(is_match._M_elems + 4),(size_type)str_1);
        if (**ppcVar5 == vVar2) {
          pcVar7 = *ppcVar5 + 1;
          if (*pcVar7 == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            pvVar3 = std::array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_12UL>::
                     operator[](fmt->aliases,(size_type)str_1);
            *fmt->value = pvVar3->second;
            bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                              (pos,end,others,others_1,others_2,others_3,others_4,others_5,others_6,
                               others_7,others_8);
            return bVar1;
          }
          ppcVar5 = std::array<const_char_*,_12UL>::operator[]
                              ((array<const_char_*,_12UL> *)(is_match._M_elems + 4),(size_type)str_1
                              );
          *ppcVar5 = pcVar7;
        }
        else {
          pvVar6 = std::array<bool,_12UL>::operator[]
                             ((array<bool,_12UL> *)((long)&k + 4),(size_type)str_1);
          *pvVar6 = false;
        }
      }
    }
    uStack_d8 = uStack_d8 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  return false;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}